

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O0

sequence * toml::detail::syntax::escaped_newline(spec *s)

{
  character_either *in_RDI;
  char_type in_stack_ffffffffffffff0f;
  character_either *this;
  either *in_stack_ffffffffffffff20;
  character_either *in_stack_ffffffffffffff28;
  either *in_stack_ffffffffffffff30;
  character *in_stack_ffffffffffffff38;
  sequence *in_stack_ffffffffffffff40;
  spec *in_stack_ffffffffffffff48;
  spec *in_stack_ffffffffffffff58;
  
  this = in_RDI;
  character::character((character *)in_RDI,in_stack_ffffffffffffff0f);
  ws(in_stack_ffffffffffffff48);
  newline(in_stack_ffffffffffffff58);
  wschar((spec *)in_stack_ffffffffffffff28);
  newline(in_stack_ffffffffffffff58);
  either::either<toml::detail::character_either,toml::detail::either>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  repeat_at_least::repeat_at_least<toml::detail::either>
            ((repeat_at_least *)in_stack_ffffffffffffff30,(size_t)in_stack_ffffffffffffff28,
             in_stack_ffffffffffffff20);
  sequence::
  sequence<toml::detail::character,toml::detail::repeat_at_least,toml::detail::either,toml::detail::repeat_at_least>
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
             (repeat_at_least *)in_stack_ffffffffffffff30,(either *)in_stack_ffffffffffffff28,
             (repeat_at_least *)in_stack_ffffffffffffff20);
  repeat_at_least::~repeat_at_least((repeat_at_least *)this);
  either::~either((either *)this);
  either::~either((either *)this);
  character_either::~character_either(this);
  either::~either((either *)this);
  repeat_at_least::~repeat_at_least((repeat_at_least *)this);
  character::~character((character *)0x6a3d4d);
  return (sequence *)in_RDI;
}

Assistant:

TOML11_INLINE sequence escaped_newline(const spec& s)
{
    return sequence(
            character('\\'), ws(s), newline(s),
            repeat_at_least(0, either(wschar(s), newline(s)))
        );
}